

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# index.c
# Opt level: O0

index_stream * index_dup_stream(index_stream *src,lzma_allocator *allocator)

{
  index_tree_node *node;
  lzma_vli local_40;
  size_t i;
  index_group *srcg;
  index_group *destg;
  index_stream *dest;
  lzma_allocator *allocator_local;
  index_stream *src_local;
  
  if (src->record_count < 0xffffffffffffffc) {
    src_local = index_stream_init((src->node).compressed_base,(src->node).uncompressed_base,
                                  src->number,src->block_number_base,allocator);
    if (src_local == (index_stream *)0x0) {
      src_local = (index_stream *)0x0;
    }
    else {
      src_local->record_count = src->record_count;
      src_local->index_list_size = src->index_list_size;
      memcpy(&src_local->stream_flags,&src->stream_flags,0x38);
      src_local->stream_padding = src->stream_padding;
      if ((src->groups).leftmost != (index_tree_node *)0x0) {
        node = (index_tree_node *)lzma_alloc(src->record_count * 0x10 + 0x40,allocator);
        if (node == (index_tree_node *)0x0) {
          index_stream_end(src_local,allocator);
          src_local = (index_stream *)0x0;
        }
        else {
          node->uncompressed_base = 0;
          node->compressed_base = 0;
          node[1].uncompressed_base = 1;
          node[1].compressed_base = src->record_count;
          node[1].parent = (index_tree_node *)(src->record_count - 1);
          i = (size_t)(src->groups).leftmost;
          local_40 = 0;
          do {
            memcpy(&node[1].left + local_40 * 2,(void *)(i + 0x40),(*(long *)(i + 0x38) + 1) * 0x10)
            ;
            local_40 = *(long *)(i + 0x38) + 1 + local_40;
            i = (size_t)index_tree_next((index_tree_node *)i);
          } while ((void *)i != (void *)0x0);
          if (local_40 != node[1].compressed_base) {
            __assert_fail("i == destg->allocated",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Utilities/cmliblzma/liblzma/common/index.c"
                          ,0x394,
                          "index_stream *index_dup_stream(const index_stream *, const lzma_allocator *)"
                         );
          }
          index_tree_append(&src_local->groups,node);
        }
      }
    }
  }
  else {
    src_local = (index_stream *)0x0;
  }
  return src_local;
}

Assistant:

static index_stream *
index_dup_stream(const index_stream *src, const lzma_allocator *allocator)
{
	// Catch a somewhat theoretical integer overflow.
	if (src->record_count > PREALLOC_MAX)
		return NULL;

	// Allocate and initialize a new Stream.
	index_stream *dest = index_stream_init(src->node.compressed_base,
			src->node.uncompressed_base, src->number,
			src->block_number_base, allocator);
	if (dest == NULL)
		return NULL;

	// Copy the overall information.
	dest->record_count = src->record_count;
	dest->index_list_size = src->index_list_size;
	dest->stream_flags = src->stream_flags;
	dest->stream_padding = src->stream_padding;

	// Return if there are no groups to duplicate.
	if (src->groups.leftmost == NULL)
		return dest;

	// Allocate memory for the Records. We put all the Records into
	// a single group. It's simplest and also tends to make
	// lzma_index_locate() a little bit faster with very big Indexes.
	index_group *destg = lzma_alloc(sizeof(index_group)
			+ src->record_count * sizeof(index_record),
			allocator);
	if (destg == NULL) {
		index_stream_end(dest, allocator);
		return NULL;
	}

	// Initialize destg.
	destg->node.uncompressed_base = 0;
	destg->node.compressed_base = 0;
	destg->number_base = 1;
	destg->allocated = src->record_count;
	destg->last = src->record_count - 1;

	// Go through all the groups in src and copy the Records into destg.
	const index_group *srcg = (const index_group *)(src->groups.leftmost);
	size_t i = 0;
	do {
		memcpy(destg->records + i, srcg->records,
				(srcg->last + 1) * sizeof(index_record));
		i += srcg->last + 1;
		srcg = index_tree_next(&srcg->node);
	} while (srcg != NULL);

	assert(i == destg->allocated);

	// Add the group to the new Stream.
	index_tree_append(&dest->groups, &destg->node);

	return dest;
}